

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

void registerPlugins(PluginManager *manager)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  PluginManager *local_10;
  PluginManager *manager_local;
  
  local_10 = manager;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/std/vector",&local_31);
  Typelib::Container::registerContainer(local_30,Vector::factory);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"/std/string",&local_69);
  Typelib::Container::registerContainer(local_68,String::factory);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void registerPlugins(Typelib::PluginManager& manager)
{
    Typelib::Container::registerContainer("/std/vector", Vector::factory);
    Typelib::Container::registerContainer("/std/string", String::factory);
}